

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::release(Private_Impl_Still *this)

{
  Private_Impl_Still *in_RDI;
  
  if ((in_RDI->_isInitialized & 1U) != 0) {
    disconnectPorts(in_RDI);
    destroyEncoder(in_RDI);
    destroyCamera(in_RDI);
    in_RDI->_isInitialized = false;
  }
  return;
}

Assistant:

void Private_Impl_Still::release() {
            if ( !_isInitialized ) return;

            disconnectPorts();

            // camera and encoder are not disabled here because it cause destroy function to not do its job properly

            destroyEncoder();
            destroyCamera();

            _isInitialized=false;
        }